

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

FUNCTION_RETURN __thiscall license::Project::initialize(Project *this)

{
  bool bVar1;
  bool bVar2;
  runtime_error *prVar3;
  _Head_base<0UL,_license::CryptoHelper_*,_false> local_2e0;
  string privateKey;
  path publicKeyFile;
  path include_folder;
  path destinationDir;
  path privateKeyFile;
  string private_key_file_str;
  ofstream ofs;
  
  std::__cxx11::string::string((string *)&ofs,(string *)&this->m_project_folder);
  std::__cxx11::string::string((string *)&publicKeyFile,(string *)this);
  boost::filesystem::operator/(&destinationDir,(path *)&ofs,&publicKeyFile);
  std::__cxx11::string::~string((string *)&publicKeyFile);
  std::__cxx11::string::~string((string *)&ofs);
  boost::filesystem::path::path(&privateKeyFile,"include");
  boost::filesystem::operator/(&publicKeyFile,&destinationDir,&privateKeyFile);
  boost::filesystem::path::path((path *)&privateKey,"licensecc");
  boost::filesystem::operator/((path *)&ofs,&publicKeyFile,(path *)&privateKey);
  std::__cxx11::string::string((string *)&private_key_file_str,(string *)this);
  boost::filesystem::operator/(&include_folder,(path *)&ofs,(path *)&private_key_file_str);
  std::__cxx11::string::~string((string *)&private_key_file_str);
  std::__cxx11::string::~string((string *)&ofs);
  std::__cxx11::string::~string((string *)&privateKey);
  std::__cxx11::string::~string((string *)&publicKeyFile);
  std::__cxx11::string::~string((string *)&privateKeyFile);
  boost::filesystem::path::path((path *)&ofs,"public_key.h");
  boost::filesystem::operator/(&publicKeyFile,&include_folder,(path *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  boost::filesystem::path::path((path *)&ofs,"private_key.rsa");
  boost::filesystem::operator/(&privateKeyFile,&destinationDir,(path *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  bVar1 = boost::filesystem::exists(&destinationDir);
  if (bVar1) {
    boost::filesystem::path::path((path *)&privateKey,"private_key.rsa");
    boost::filesystem::operator/((path *)&ofs,&destinationDir,(path *)&privateKey);
    bVar1 = boost::filesystem::exists((path *)&ofs);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::string::~string((string *)&privateKey);
    if ((this->m_force_overwrite & bVar1) == 1) {
      boost::filesystem::path::path((path *)&privateKey,"private_key.rsa");
      boost::filesystem::operator/((path *)&ofs,&destinationDir,(path *)&privateKey);
      boost::filesystem::remove((char *)&ofs);
      std::__cxx11::string::~string((string *)&ofs);
      std::__cxx11::string::~string((string *)&privateKey);
      boost::filesystem::remove((char *)&publicKeyFile);
      bVar1 = false;
    }
    bVar2 = boost::filesystem::exists(&include_folder);
    if (!bVar2) {
      bVar2 = boost::filesystem::create_directories(&include_folder);
      if (!bVar2) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&privateKey,"Cannot create public key directory [",&include_folder.m_pathname
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                       &privateKey,"]");
        std::runtime_error::runtime_error(prVar3,(string *)&ofs);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
LAB_0018185f:
    CryptoHelper::getInstance();
    if (bVar1 == false) {
      std::ofstream::ofstream(&ofs);
      (**(local_2e0._M_head_impl)->_vptr_CryptoHelper)();
      (*(local_2e0._M_head_impl)->_vptr_CryptoHelper[1])(&privateKey);
      std::__cxx11::string::string((string *)&private_key_file_str,(string *)&privateKeyFile);
      std::ofstream::open((char *)&ofs,(_Ios_Openmode)private_key_file_str._M_dataplus._M_p);
      std::operator<<((ostream *)&ofs,(string *)&privateKey);
      std::ofstream::close();
      exportPublicKey(this,&include_folder.m_pathname,
                      (unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                       *)&local_2e0);
      std::__cxx11::string::~string((string *)&private_key_file_str);
      std::__cxx11::string::~string((string *)&privateKey);
      std::ofstream::~ofstream(&ofs);
    }
    else {
      bVar1 = boost::filesystem::exists(&publicKeyFile);
      if (!bVar1) {
        (*(local_2e0._M_head_impl)->_vptr_CryptoHelper[3])(local_2e0._M_head_impl,&privateKeyFile);
        exportPublicKey(this,&include_folder.m_pathname,
                        (unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                         *)&local_2e0);
      }
    }
    if (local_2e0._M_head_impl != (CryptoHelper *)0x0) {
      (*(local_2e0._M_head_impl)->_vptr_CryptoHelper[7])();
    }
    std::__cxx11::string::~string((string *)&privateKeyFile);
    std::__cxx11::string::~string((string *)&publicKeyFile);
    std::__cxx11::string::~string((string *)&include_folder);
    std::__cxx11::string::~string((string *)&destinationDir);
    return FUNC_RET_OK;
  }
  bVar1 = boost::filesystem::create_directories(&destinationDir);
  if (bVar1) {
    bVar1 = boost::filesystem::create_directories(&include_folder);
    if (bVar1) {
      bVar1 = false;
      goto LAB_0018185f;
    }
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&privateKey,"Cannot create destination directory [",&destinationDir.m_pathname);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                 &privateKey,"]");
  std::runtime_error::runtime_error(prVar3,(string *)&ofs);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FUNCTION_RETURN Project::initialize() {
	const fs::path destinationDir(fs::path(m_project_folder) / m_name);
	const fs::path include_folder(publicKeyFolder(destinationDir, m_name));
	const fs::path publicKeyFile(include_folder / PUBLIC_KEY_INC_FNAME);
	const fs::path privateKeyFile(destinationDir / PRIVATE_KEY_FNAME);
	bool keyFilesExist = false;
	if (fs::exists(destinationDir)) {
		keyFilesExist = fs::exists(destinationDir / PRIVATE_KEY_FNAME);
		if (m_force_overwrite && keyFilesExist) {
			keyFilesExist = false;
			fs::remove(destinationDir / PRIVATE_KEY_FNAME);
			fs::remove(publicKeyFile);
		}
		if (!fs::exists(include_folder)) {
			if (!fs::create_directories(include_folder)) {
				throw std::runtime_error("Cannot create public key directory [" + include_folder.string() + "]");
			}
		}
	} else if (!fs::create_directories(destinationDir) || !fs::create_directories(include_folder)) {
		throw std::runtime_error("Cannot create destination directory [" + destinationDir.string() + "]");
	}
	FUNCTION_RETURN result = FUNC_RET_OK;
	unique_ptr<CryptoHelper> cryptoHelper(CryptoHelper::getInstance());
	if (keyFilesExist) {
		if (!fs::exists(publicKeyFile)) {
			// how strange, private key was found, but public key is not.
			// Let's regenerate public key
			cryptoHelper->loadPrivateKey_file(privateKeyFile.string());
			exportPublicKey(include_folder.string(), cryptoHelper);
		}
	} else {
		ofstream ofs;
		cryptoHelper->generateKeyPair();
		const std::string privateKey = cryptoHelper->exportPrivateKey();
		const string private_key_file_str = privateKeyFile.string();
		ofs.open(private_key_file_str.c_str(), std::fstream::trunc | std::fstream::binary);
		ofs << privateKey;
		ofs.close();
		exportPublicKey(include_folder.string(), cryptoHelper);
	}
	return result;
}